

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

void __thiscall
Vector::resize(Vector *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *ptr,
              size_t new_size)

{
  ulong uVar1;
  bool bVar2;
  runtime_error *this_00;
  reference pvVar3;
  pointer puVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  pointer local_f0;
  size_t i_2;
  size_t i_1;
  size_t copy_raw_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_buffer;
  size_t i;
  char local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  pointer local_48;
  size_t new_raw_size;
  size_t old_size;
  size_t old_raw_size;
  size_t element_size;
  Type *element_t;
  size_t new_size_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ptr_local;
  Vector *this_local;
  
  element_t = (Type *)new_size;
  new_size_local = (size_t)ptr;
  ptr_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  element_size = Typelib::Indirect::getIndirection();
  Typelib::Indirect::getIndirection();
  old_raw_size = Typelib::Type::getSize();
  old_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)new_size_local);
  new_raw_size = (**(code **)(*(long *)this + 200))(this,new_size_local);
  local_48 = (pointer)((long)element_t * old_raw_size);
  bVar2 = hasElementLayout(this);
  if (bVar2) {
    bVar2 = isElementMemcpy(this);
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)new_size_local,
                 (size_type)local_48);
    }
    else {
      if (element_t < new_raw_size) {
        for (new_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = local_48;
            new_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < old_size;
            new_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 new_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + old_raw_size) {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              new_size_local,
                              (size_type)
                              new_buffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          Typelib::destroy(pvVar3,&this->element_layout);
        }
      }
      puVar4 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   new_size_local);
      if (puVar4 < local_48) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&copy_raw_size);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&copy_raw_size,
                   (size_type)local_48);
        puVar5 = std::min<unsigned_long>(&old_size,(unsigned_long *)&local_48);
        uVar1 = *puVar5;
        for (i_2 = 0; i_2 < uVar1; i_2 = old_raw_size + i_2) {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &copy_raw_size,i_2);
          Typelib::init(pvVar3,&this->element_layout);
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &copy_raw_size,i_2);
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              new_size_local,i_2);
          Typelib::copy(pvVar3,pvVar6,&this->element_layout);
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              new_size_local,i_2);
          Typelib::destroy(pvVar3,&this->element_layout);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)new_size_local,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&copy_raw_size);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&copy_raw_size);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)new_size_local,
                   (size_type)local_48);
      }
      if (new_raw_size < element_t) {
        for (local_f0 = (pointer)old_size; local_f0 < local_48; local_f0 = local_f0 + old_raw_size)
        {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              new_size_local,(size_type)local_f0);
          Typelib::init(pvVar3,&this->element_layout);
        }
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  Typelib::Type::getName_abi_cxx11_();
  std::operator+(local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "could not compute layout for element type ");
  std::operator+(local_68,local_88);
  std::runtime_error::runtime_error(this_00,(string *)local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Vector::resize(std::vector<uint8_t>* ptr, size_t new_size) const
{
    Type const& element_t = getIndirection();
    size_t element_size = getIndirection().getSize();

    size_t old_raw_size   = ptr->size();
    size_t old_size       = getElementCount(ptr);
    size_t new_raw_size   = new_size * element_size;

    if (!hasElementLayout())
        throw std::runtime_error("could not compute layout for element type " + element_t.getName() + ", cannot copy");

    if (isElementMemcpy())
    {
        ptr->resize(new_raw_size);
        return;
    }


    if (old_size > new_size)
    {
        // Need to destroy the elements that are at the end of the container
        for (size_t i = new_raw_size; i < old_raw_size; i += element_size)
            Typelib::destroy(&(*ptr)[i], element_layout);
    }


    if (ptr->capacity() >= new_raw_size)
        ptr->resize(new_raw_size);
    else
    {
        std::vector<uint8_t> new_buffer;
        new_buffer.resize(new_raw_size);
        size_t copy_raw_size = std::min(old_raw_size, new_raw_size);
        for (size_t i = 0; i < copy_raw_size; i += element_size)
        {
            Typelib::init(&new_buffer[i], element_layout);
            Typelib::copy(&new_buffer[i], &(*ptr)[i], element_layout);
            Typelib::destroy(&(*ptr)[i], element_layout);
        }
        ptr->swap(new_buffer);
    }

    if (old_size < new_size)
    {
        // Need to initialize the new elements at the end of the container
        for (size_t i = old_raw_size; i < new_raw_size; i += element_size)
            Typelib::init(&(*ptr)[i], element_layout);
    }
}